

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_client_handle_message
              (ptls_t *tls,ptls_buffer_t *sendbuf,size_t *epoch_offsets,size_t in_epoch,void *input,
              size_t inlen,ptls_handshake_properties_t *properties)

{
  ptls_message_emitter_t *ppVar1;
  ptls_message_emitter_t *in_RCX;
  _func_int_ptls_t_ptr_ptls_message_emitter_t_ptr_ptls_iovec_t_int_ptls_handshake_properties_t_ptr
  *in_RDX;
  ptls_t *in_RSI;
  long in_RDI;
  st_ptls_record_t *in_R8;
  ptls_handshake_properties_t *in_R9;
  st_ptls_record_t rec;
  st_ptls_raw_message_emitter_t emitter;
  ptls_iovec_t *in_stack_00000678;
  ptls_handshake_properties_t *in_stack_00000680;
  ptls_message_emitter_t *in_stack_00000688;
  ptls_t *in_stack_00000690;
  undefined1 in_stack_ffffffffffffff79;
  undefined4 in_stack_ffffffffffffff7c;
  int local_4;
  
  if ((*(byte *)(in_RDI + 0x160) & 1) == 0) {
    if (in_R8 == (st_ptls_record_t *)0x0) {
      local_4 = send_client_hello(in_stack_00000690,in_stack_00000688,in_stack_00000680,
                                  in_stack_00000678);
    }
    else {
      ppVar1 = (ptls_message_emitter_t *)
               ptls_get_read_epoch((ptls_t *)
                                   CONCAT44(in_stack_ffffffffffffff7c,
                                            (uint)CONCAT11(in_stack_ffffffffffffff79,0x16)));
      if (ppVar1 == in_RCX) {
        local_4 = handle_handshake_record(in_RSI,in_RDX,in_RCX,in_R8,in_R9);
      }
      else {
        local_4 = 10;
      }
    }
    return local_4;
  }
  __assert_fail("!tls->is_server",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                ,0x1510,
                "int ptls_client_handle_message(ptls_t *, ptls_buffer_t *, size_t *, size_t, const void *, size_t, ptls_handshake_properties_t *)"
               );
}

Assistant:

int ptls_client_handle_message(ptls_t *tls, ptls_buffer_t *sendbuf, size_t epoch_offsets[5], size_t in_epoch, const void *input,
                               size_t inlen, ptls_handshake_properties_t *properties)
{
    assert(!tls->is_server);

    struct st_ptls_raw_message_emitter_t emitter = {
        {sendbuf, &tls->traffic_protection.enc, 0, begin_raw_message, commit_raw_message}, SIZE_MAX, epoch_offsets};
    struct st_ptls_record_t rec = {PTLS_CONTENT_TYPE_HANDSHAKE, 0, inlen, input};

    if (input == NULL)
        return send_client_hello(tls, &emitter.super, properties, NULL);

    if (ptls_get_read_epoch(tls) != in_epoch)
        return PTLS_ALERT_UNEXPECTED_MESSAGE;

    return handle_handshake_record(tls, handle_client_handshake_message, &emitter.super, &rec, properties);
}